

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix_test.cc
# Opt level: O2

void anon_unknown.dwarf_e94e::CheckCloseOnExecDoesNotLeakFDs
               (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                *baseline_open_fds)

{
  pointer __path;
  FILE *__stream;
  int *piVar1;
  int __val;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  long *plVar2;
  char *pcVar3;
  char *in_R9;
  __node_base *p_Var4;
  bool bVar5;
  int child_status;
  int fd;
  undefined4 uStack_114;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  AssertHelper local_108;
  int child_pid;
  AssertionResult gtest_ar_2;
  char *child_argv [4];
  vector<char,_std::allocator<char>_> fd_buffer;
  AssertHelper local_98;
  string fd_string;
  __node_base_ptr p_Stack_60;
  char switch_buffer [28];
  vector<char,_std::allocator<char>_> *this;
  
  builtin_strncpy(switch_buffer + 0x10,"exec-helper",0xc);
  builtin_strncpy(switch_buffer,"--test-close-on-",0x10);
  fd_string._M_dataplus._M_p = (pointer)&p_Stack_60;
  fd_string._M_string_length = 1;
  fd_string.field_2._M_allocated_capacity = 0;
  fd_string.field_2._8_8_ = 0;
  p_Stack_60 = (__node_base_ptr)0x0;
  GetOpenFileDescriptors
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &fd_string);
  p_Var4 = &(baseline_open_fds->_M_h)._M_before_begin;
  while( true ) {
    p_Var4 = p_Var4->_M_nxt;
    if (p_Var4 == (__node_base *)0x0) break;
    fd = (int)*(size_type *)(p_Var4 + 1);
    fd_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(fd_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,1);
    gtest_ar_2._0_8_ =
         std::
         _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
         ::count((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&fd_string,&fd);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)child_argv,"1","open_fds.count(fd)",(int *)&fd_buffer,
               (unsigned_long *)&gtest_ar_2);
    if ((char)child_argv[0] == '\0') {
      testing::Message::Message((Message *)&gtest_ar_2);
      std::operator<<((ostream *)(gtest_ar_2._0_8_ + 0x10),
                      "Previously opened file descriptor was closed during test setup");
      if (child_argv[1] == (char *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)child_argv[1];
      }
      this = &fd_buffer;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
                 ,0x76,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)this,(Message *)&gtest_ar_2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this);
      if (gtest_ar_2._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
      }
      goto LAB_0010a67f;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(child_argv + 1));
    std::
    _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&fd_string,&fd);
  }
  fd_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT44(fd_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,1);
  gtest_ar_2._0_8_ = fd_string.field_2._8_8_;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)child_argv,"1","open_fds.size()",(int *)&fd_buffer,
             (unsigned_long *)&gtest_ar_2);
  if ((char)child_argv[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    std::operator<<((ostream *)(gtest_ar_2._0_8_ + 0x10),
                    "Expected exactly one newly opened file descriptor during test setup");
    if (child_argv[1] == (char *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)child_argv[1];
    }
    this = (vector<char,_std::allocator<char>_> *)(child_argv + 1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fd_buffer,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
               ,0x7a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fd_buffer,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fd_buffer);
    if (gtest_ar_2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
    }
LAB_0010a67f:
    __val = (int)this;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(child_argv + 1));
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(child_argv + 1));
    __val = *(int *)(fd_string.field_2._M_allocated_capacity + 8);
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&fd_string);
  std::__cxx11::to_string(&fd_string,__val);
  fd_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  fd_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  fd_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char,std::allocator<char>>::
  _M_range_initialize<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((vector<char,std::allocator<char>> *)&fd_buffer,fd_string._M_dataplus._M_p,
             fd_string._M_dataplus._M_p + fd_string._M_string_length);
  child_argv[0] = (char *)((ulong)child_argv[0] & 0xffffffffffffff00);
  std::vector<char,_std::allocator<char>_>::emplace_back<char>(&fd_buffer,(char *)child_argv);
  GetArgvZero();
  __path = GetArgvZero::program_name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  child_argv[0] =
       GetArgvZero::program_name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  child_argv[1] = switch_buffer;
  child_argv[2] =
       fd_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  child_argv[3] = (char *)0x0;
  child_pid = fork();
  if (child_pid == 0) {
    execv(__path,child_argv);
    __stream = _stderr;
    piVar1 = __errno_location();
    pcVar3 = strerror(*piVar1);
    fprintf(__stream,"Error spawning child process: %s\n",pcVar3);
    exit(0x3d);
  }
  child_status = 0;
  fd = waitpid(child_pid,&child_status,0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_2,"child_pid","::waitpid(child_pid, &child_status, 0)",&child_pid
             ,&fd);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&fd);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    this_00 = &gtest_ar_2.message_;
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&fd);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    plVar2 = (long *)CONCAT44(uStack_114,fd);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_110;
    local_110._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    bVar5 = (child_status & 0x7fU) == 0;
    fd = CONCAT31(fd._1_3_,bVar5);
    if (bVar5) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_00);
      fd = 0;
      local_108.data_._0_4_ = (uint)child_status >> 8 & 0xff;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_2,"0","(((child_status) & 0xff00) >> 8)",&fd,
                 (int *)&local_108);
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)&fd);
        std::operator<<((ostream *)(CONCAT44(uStack_114,fd) + 0x10),
                        "The helper process encountered an error");
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
                   ,0x9f,pcVar3);
        testing::internal::AssertHelper::operator=(&local_108,(Message *)&fd);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        if ((long *)CONCAT44(uStack_114,fd) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(uStack_114,fd) + 8))();
        }
      }
      this_00 = &gtest_ar_2.message_;
      goto LAB_0010a8e3;
    }
    testing::Message::Message((Message *)&local_108);
    std::operator<<((ostream *)(CONCAT44(local_108.data_._4_4_,(uint)local_108.data_) + 0x10),
                    "The helper process did not exit with an exit code");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2,(internal *)&fd,(AssertionResult *)"WIFEXITED(child_status)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
               ,0x9d,(char *)gtest_ar_2._0_8_);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::_M_dispose();
    plVar2 = (long *)CONCAT44(local_108.data_._4_4_,(uint)local_108.data_);
  }
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
LAB_0010a8e3:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&fd_buffer.super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void CheckCloseOnExecDoesNotLeakFDs(
    const std::unordered_set<int>& baseline_open_fds) {
  // Prepare the argument list for the child process.
  // execv() wants mutable buffers.
  char switch_buffer[sizeof(kTestCloseOnExecSwitch)];
  std::memcpy(switch_buffer, kTestCloseOnExecSwitch,
              sizeof(kTestCloseOnExecSwitch));

  int probed_fd;
  GetNewlyOpenedFileDescriptor(baseline_open_fds, &probed_fd);
  std::string fd_string = std::to_string(probed_fd);
  std::vector<char> fd_buffer(fd_string.begin(), fd_string.end());
  fd_buffer.emplace_back('\0');

  // The helper process is launched with the command below.
  //      env_posix_tests --test-close-on-exec-helper 3
  char* child_argv[] = {GetArgvZero()->data(), switch_buffer, fd_buffer.data(),
                        nullptr};

  constexpr int kForkInChildProcessReturnValue = 0;
  int child_pid = fork();
  if (child_pid == kForkInChildProcessReturnValue) {
    ::execv(child_argv[0], child_argv);
    std::fprintf(stderr, "Error spawning child process: %s\n", strerror(errno));
    std::exit(kTextCloseOnExecHelperExecFailedCode);
  }

  int child_status = 0;
  ASSERT_EQ(child_pid, ::waitpid(child_pid, &child_status, 0));
  ASSERT_TRUE(WIFEXITED(child_status))
      << "The helper process did not exit with an exit code";
  ASSERT_EQ(0, WEXITSTATUS(child_status))
      << "The helper process encountered an error";
}